

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O3

void duckdb::DuckDBExternalFileCacheFun::RegisterFunction(BuiltinFunctions *set)

{
  vector<duckdb::LogicalType,_true> local_208;
  string local_1f0;
  TableFunction local_1d0;
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"duckdb_external_file_cache","");
  local_208.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1d0,&local_1f0,&local_208,DuckDBExternalFileCacheFunction,
             DuckDBExternalFileCacheBind,DuckDBExternalFileCacheInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1d0);
  local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02439e90;
  if (local_1d0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d0.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DuckDBExternalFileCacheFun::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("duckdb_external_file_cache", {}, DuckDBExternalFileCacheFunction,
	                              DuckDBExternalFileCacheBind, DuckDBExternalFileCacheInit));
}